

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

bool __thiscall
HighsMipSolverData::addIncumbent
          (HighsMipSolverData *this,vector<double,_std::allocator<double>_> *sol,double solobj,
          int solution_source,bool print_display_line,bool is_user_solution)

{
  HighsCallback *pHVar1;
  HighsOptions *pHVar2;
  byte bVar3;
  undefined3 in_register_00000081;
  bool bVar4;
  double to_upper_bound;
  double dVar5;
  reference rVar6;
  
  if (((CONCAT31(in_register_00000081,is_user_solution) == 0) && (this->mipsolver->submip == false))
     && (pHVar1 = this->mipsolver->callback_,
        (pHVar1->user_callback).super__Function_base._M_manager != (_Manager_type)0x0)) {
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](&pHVar1->active,3);
    bVar4 = (*rVar6._M_p & rVar6._M_mask) != 0;
  }
  else {
    bVar4 = false;
  }
  dVar5 = this->upper_bound;
  if ((bVar4) || (to_upper_bound = 0.0, solobj < dVar5)) {
    to_upper_bound = transformNewIntegerFeasibleSolution(this,sol,solobj < dVar5);
  }
  if (dVar5 <= solobj) {
    bVar4 = true;
    if ((this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<double,_std::allocator<double>_>::operator=(&this->incumbent,sol);
    }
  }
  else {
    dVar5 = this->upper_bound;
    if (dVar5 <= to_upper_bound) {
      bVar4 = false;
    }
    else {
      this->upper_bound = to_upper_bound;
      if (((to_upper_bound != dVar5) || (NAN(to_upper_bound) || NAN(dVar5))) &&
         (this->mipsolver->submip == false)) {
        updatePrimalDualIntegral
                  (this,this->lower_bound,this->lower_bound,dVar5,to_upper_bound,false,false);
      }
      std::vector<double,_std::allocator<double>_>::operator=(&this->incumbent,sol);
      dVar5 = computeNewUpperLimit(this,to_upper_bound,0.0,0.0);
      if ((!is_user_solution) && (this->mipsolver->submip == false)) {
        saveReportMipSolution(this,dVar5);
      }
      bVar4 = true;
      if (dVar5 < this->upper_limit) {
        this->numImprovingSols = this->numImprovingSols + 1;
        this->upper_limit = dVar5;
        pHVar2 = this->mipsolver->options_mip_;
        dVar5 = computeNewUpperLimit
                          (this,to_upper_bound,(pHVar2->super_HighsOptionsStruct).mip_abs_gap,
                           (pHVar2->super_HighsOptionsStruct).mip_rel_gap);
        this->optimality_limit = dVar5;
        (this->nodequeue).optimality_limit = dVar5;
        HighsDomain::propagate(&this->domain);
        bVar3 = (this->domain).infeasible_;
        if ((bool)bVar3 == false) {
          HighsRedcostFixing::propagateRootRedcost(&this->redcostfixing,this->mipsolver);
          bVar3 = (this->domain).infeasible_;
        }
        if (((bVar3 & 1) == 0) &&
           (HighsCliqueTable::extractObjCliques(&this->cliquetable,this->mipsolver),
           (this->domain).infeasible_ != true)) {
          dVar5 = HighsNodeQueue::performBounding(&this->nodequeue,this->upper_limit);
          HighsCDouble::operator+=(&this->pruned_treeweight,dVar5);
        }
        else {
          (this->pruned_treeweight).hi = 1.0;
          (this->pruned_treeweight).lo = 0.0;
          HighsNodeQueue::clear(&this->nodequeue);
          if (!print_display_line) {
            return true;
          }
        }
        printDisplayLine(this,solution_source);
      }
    }
  }
  return bVar4;
}

Assistant:

bool HighsMipSolverData::addIncumbent(const std::vector<double>& sol,
                                      double solobj, const int solution_source,
                                      const bool print_display_line,
                                      const bool is_user_solution) {
  const bool execute_mip_solution_callback =
      !is_user_solution && !mipsolver.submip &&
      (mipsolver.callback_->user_callback
           ? mipsolver.callback_->active[kCallbackMipSolution]
           : false);
  // Determine whether the potential new incumbent should be
  // transformed
  //
  // Happens if solobj improves on the upper bound or the MIP solution
  // callback is active
  const bool possibly_store_as_new_incumbent = solobj < upper_bound;
  const bool get_transformed_solution =
      possibly_store_as_new_incumbent || execute_mip_solution_callback;
  // Get the transformed objective and solution if required
  const double transformed_solobj =
      get_transformed_solution ? transformNewIntegerFeasibleSolution(
                                     sol, possibly_store_as_new_incumbent)
                               : 0;

  if (possibly_store_as_new_incumbent) {
    solobj = transformed_solobj;
    if (solobj >= upper_bound) return false;

    double prev_upper_bound = upper_bound;

    upper_bound = solobj;

    bool bound_change = upper_bound != prev_upper_bound;
    if (!mipsolver.submip && bound_change)
      updatePrimalDualIntegral(lower_bound, lower_bound, prev_upper_bound,
                               upper_bound);

    incumbent = sol;
    double new_upper_limit = computeNewUpperLimit(solobj, 0.0, 0.0);

    if (!is_user_solution && !mipsolver.submip)
      saveReportMipSolution(new_upper_limit);
    if (new_upper_limit < upper_limit) {
      ++numImprovingSols;
      upper_limit = new_upper_limit;
      optimality_limit =
          computeNewUpperLimit(solobj, mipsolver.options_mip_->mip_abs_gap,
                               mipsolver.options_mip_->mip_rel_gap);
      nodequeue.setOptimalityLimit(optimality_limit);
      debugSolution.newIncumbentFound();
      domain.propagate();
      if (!domain.infeasible()) redcostfixing.propagateRootRedcost(mipsolver);

      // Two calls to printDisplayLine added for completeness,
      // ensuring that when the root node has an integer solution, a
      // logging line is issued

      if (domain.infeasible()) {
        pruned_treeweight = 1.0;
        nodequeue.clear();
        if (print_display_line)
          printDisplayLine(solution_source);  // Added for completeness
        return true;
      }
      cliquetable.extractObjCliques(mipsolver);
      if (domain.infeasible()) {
        pruned_treeweight = 1.0;
        nodequeue.clear();
        if (print_display_line)
          printDisplayLine(solution_source);  // Added for completeness
        return true;
      }
      pruned_treeweight += nodequeue.performBounding(upper_limit);
      printDisplayLine(solution_source);
    }
  } else if (incumbent.empty())
    incumbent = sol;

  return true;
}